

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::DefaultMinimize::propagateImpl(DefaultMinimize *this,Solver *s,PropMode m)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  Literal LVar4;
  uint32 i;
  uint *puVar5;
  int in_EDX;
  Solver *in_RSI;
  DefaultMinimize *in_RDI;
  wsum_t *opt;
  wsum_t *sum;
  bool ok;
  uint32 undoPos;
  weight_t lastW;
  uint32 impLevel;
  uint32 DL;
  uint32 idx;
  Iter it;
  undefined4 in_stack_ffffffffffffff58;
  Var in_stack_ffffffffffffff5c;
  Solver *in_stack_ffffffffffffff60;
  uint32 in_stack_ffffffffffffff68;
  uint32 in_stack_ffffffffffffff6c;
  Solver *in_stack_ffffffffffffff70;
  Solver *this_00;
  undefined7 in_stack_ffffffffffffff78;
  byte bVar6;
  WeightLiteral *lit;
  undefined4 in_stack_ffffffffffffff90;
  uint32 in_stack_ffffffffffffff94;
  uint32 uVar7;
  Literal in_stack_ffffffffffffffa4;
  uint32 local_44;
  byte local_3d;
  uint32 local_3c;
  int local_38;
  uint32 local_34;
  Iter p;
  undefined4 in_stack_ffffffffffffffe0;
  
  p = in_RDI->pos_;
  i = (uint32)((long)p - (long)((in_RDI->super_MinimizeConstraint).shared_ + 1) >> 3);
  uVar2 = Solver::decisionLevel((Solver *)0x1aea2f);
  local_34 = uVar2 + (in_EDX == 1);
  local_38 = -1;
  local_3c = in_RDI->undoTop_;
  local_3d = 1;
  lit = (WeightLiteral *)&in_RDI->actLev_;
  local_44 = SharedMinimizeData::level
                       ((SharedMinimizeData *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  puVar5 = std::min<unsigned_int>((uint *)lit,&local_44);
  in_RDI->actLev_ = *puVar5;
  DefaultMinimize::sum(in_RDI);
  DefaultMinimize::opt(in_RDI);
  do {
    bVar6 = 0;
    this_00 = in_RSI;
    if ((local_3d & 1) != 0) {
      in_stack_ffffffffffffffa4.rep_ = (p->first).rep_;
      bVar1 = isSentinel((Literal)0x0);
      bVar6 = bVar1 ^ 0xff;
      this_00 = in_RSI;
    }
    if ((bVar6 & 1) == 0) {
      return (bool)(local_3d & 1);
    }
    bVar1 = litSeen(in_RDI,i);
    in_RSI = this_00;
    if ((!bVar1) &&
       ((in_EDX != 0 ||
        (bVar1 = Solver::isFalse((Solver *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 (Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20)),
        in_RSI = this_00, !bVar1)))) {
      if (local_38 != p->second) {
        bVar1 = SharedMinimizeData::imp
                          ((SharedMinimizeData *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (wsum_t *)in_RDI,lit,(wsum_t *)CONCAT17(bVar6,in_stack_ffffffffffffff78),
                           (uint32 *)in_stack_ffffffffffffff70);
        if (!bVar1) {
          in_RDI->pos_ = p;
          return true;
        }
        if (in_EDX == 1) {
          local_34 = computeImplicationSet
                               ((DefaultMinimize *)this_00,
                                (Solver *)CONCAT44(1,in_stack_ffffffffffffffe0),p,
                                (uint32 *)CONCAT44(i,uVar2));
        }
        local_38 = p->second;
      }
      uVar7 = (p->first).rep_;
      bVar1 = Solver::isFalse((Solver *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (Literal)(uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      if (bVar1) {
        in_RSI = this_00;
        if (local_34 < uVar2) {
          Literal::var(&p->first);
          uVar3 = Solver::level(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          in_stack_ffffffffffffff70 = this_00;
          this_00 = in_RSI;
          if (local_34 < uVar3) goto LAB_001aec2b;
        }
      }
      else {
LAB_001aec2b:
        in_stack_ffffffffffffff60 = this_00;
        if (local_34 != uVar2) {
          uVar2 = Solver::undoUntil(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                    in_stack_ffffffffffffff68);
        }
        in_RSI = in_stack_ffffffffffffff60;
        LVar4 = Literal::operator~((Literal *)
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff6c = local_34;
        Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffff90,(Constraint *)in_RDI);
        local_3d = Solver::force((Solver *)CONCAT44(uVar7,LVar4.rep_),in_stack_ffffffffffffffa4,
                                 in_stack_ffffffffffffff94,(Antecedent *)in_RDI,
                                 (uint32)((ulong)lit >> 0x20));
      }
    }
    p = p + 1;
    i = i + 1;
  } while( true );
}

Assistant:

bool DefaultMinimize::propagateImpl(Solver& s, PropMode m) {
	Iter it    = pos_;
	uint32 idx = static_cast<uint32>(it - shared_->lits);
	uint32 DL  = s.decisionLevel();
	// current implication level or "unknown" if
	// we propagate a new optimum
	uint32 impLevel = DL + (m == propagate_new_opt);
	weight_t lastW  = -1;
	uint32 undoPos  = undoTop_;
	bool ok         = true;
	actLev_         = std::min(actLev_, shared_->level(idx));
	for (wsum_t* sum= this->sum(), *opt = this->opt(); ok && !isSentinel(it->first); ++it, ++idx) {
		// skip propagated/false literals
		if (litSeen(idx) || (m == propagate_new_sum && s.isFalse(it->first))) {
			continue;
		}
		if (lastW != it->second) {
			// check if the current weight is implied
			if (!STRATEGY(imp(sum, *it, opt, actLev_))) {
				// all good - current optimum is safe
				pos_    = it;
				return true;
			}
			// compute implication set and level of current weight
			if (m == propagate_new_opt) {
				impLevel = computeImplicationSet(s, *it, undoPos);
			}
			lastW = it->second;
		}
		assert(active());
		// force implied literals
		if (!s.isFalse(it->first) || (impLevel < DL && s.level(it->first.var()) > impLevel)) {
			if (impLevel != DL) { DL = s.undoUntil(impLevel, Solver::undo_pop_bt_level); }
			ok = s.force(~it->first, impLevel, this, undoPos);
		}
	}
	return ok;
}